

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

bool crnlib::dxt_fast::match_block_colors
               (uint n,color_quad_u8 *pBlock,color_quad_u8 *pColors,uint8 *pSelectors)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8 local_65;
  uint uStack_60;
  uint8 s;
  int dot;
  uint i_1;
  bool status;
  int c3Point;
  int halfPoint;
  int c0Point;
  int i;
  int stops [4];
  int dirb;
  int dirg;
  int dirr;
  uint8 *pSelectors_local;
  color_quad_u8 *pColors_local;
  color_quad_u8 *pBlock_local;
  uint n_local;
  
  iVar1 = (uint)(pColors->field_0).field_0.r - (uint)pColors[1].field_0.field_0.r;
  iVar2 = (uint)(pColors->field_0).field_0.g - (uint)pColors[1].field_0.field_0.g;
  stops[3] = (uint)(pColors->field_0).field_0.b - (uint)pColors[1].field_0.field_0.b;
  for (halfPoint = 0; halfPoint < 4; halfPoint = halfPoint + 1) {
    (&c0Point)[halfPoint] =
         (uint)pColors[halfPoint].field_0.field_0.r * iVar1 +
         (uint)pColors[halfPoint].field_0.field_0.g * iVar2 +
         (uint)pColors[halfPoint].field_0.field_0.b * stops[3];
  }
  dot._3_1_ = false;
  for (uStack_60 = 0; uStack_60 < n; uStack_60 = uStack_60 + 1) {
    iVar3 = (uint)pBlock[uStack_60].field_0.field_0.r * iVar1 +
            (uint)pBlock[uStack_60].field_0.field_0.g * iVar2 +
            (uint)pBlock[uStack_60].field_0.field_0.b * stops[3];
    if (iVar3 < stops[1] + stops[0] >> 1) {
      local_65 = '\x03';
      if (iVar3 < i + stops[1] >> 1) {
        local_65 = '\x01';
      }
    }
    else {
      local_65 = '\0';
      if (iVar3 < stops[0] + c0Point >> 1) {
        local_65 = '\x02';
      }
    }
    pSelectors[uStack_60] = local_65;
    if (local_65 != *pSelectors) {
      dot._3_1_ = true;
    }
  }
  return dot._3_1_;
}

Assistant:

static bool match_block_colors(uint n, const color_quad_u8* pBlock, const color_quad_u8* pColors, uint8* pSelectors)
        {
            int dirr = pColors[0].r - pColors[1].r;
            int dirg = pColors[0].g - pColors[1].g;
            int dirb = pColors[0].b - pColors[1].b;

            int stops[4];
            for (int i = 0; i < 4; i++)
            {
                stops[i] = pColors[i].r * dirr + pColors[i].g * dirg + pColors[i].b * dirb;
            }

            // 0 2 3 1
            int c0Point = stops[1] + stops[3];
            int halfPoint = stops[3] + stops[2];
            int c3Point = stops[2] + stops[0];

            //dirr *= 2;
            //dirg *= 2;
            //dirb *= 2;
            c0Point >>= 1;
            halfPoint >>= 1;
            c3Point >>= 1;

            bool status = false;
            for (uint i = 0; i < n; i++)
            {
                int dot = pBlock[i].r * dirr + pBlock[i].g * dirg + pBlock[i].b * dirb;

                uint8 s;
                if (dot < halfPoint)
                {
                    s = (dot < c0Point) ? 1 : 3;
                }
                else
                {
                    s = (dot < c3Point) ? 2 : 0;
                }

                pSelectors[i] = s;

                if (s != pSelectors[0])
                {
                    status = true;
                }
            }

            return status;
        }